

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccessmanager.cpp
# Opt level: O0

QNetworkReply * __thiscall
QNetworkAccessManager::createRequest
          (QNetworkAccessManager *this,Operation op,QNetworkRequest *originalReq,
          QIODevice *outgoingData)

{
  QAnyStringView value;
  QAnyStringView newValue;
  bool bVar1;
  byte bVar2;
  byte bVar3;
  RedirectPolicy RVar4;
  int iVar5;
  QNetworkAccessManagerPrivate *pQVar6;
  QNetworkReplyImplPrivate *pQVar7;
  void *pvVar8;
  ulong uVar9;
  char16_t (*pacVar10) [17];
  char16_t (*pacVar11) [17];
  char16_t (*pacVar12) [17];
  QNetworkReplyImplPrivate *pQVar13;
  QNetworkAccessBackend *pQVar14;
  long *in_RCX;
  int in_ESI;
  QNetworkRequest *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar15;
  QNetworkReplyImplPrivate *priv;
  QNetworkReplyImpl *reply;
  QNetworkReplyHttpImpl *reply_2;
  bool isLocalSocket;
  QNetworkReplyImplPrivate *priv_1;
  QNetworkReplyImpl *reply_1;
  CacheLoadControl mode;
  bool isLocalFile;
  QNetworkAccessManagerPrivate *d;
  QUrl stsUrl;
  QList<QNetworkCookie> cookies;
  QHttpHeaders h;
  QNetworkRequest request;
  QUrl url;
  QString scheme;
  QNetworkRequest req;
  char16_t httpSchemes [5] [17];
  milliseconds in_stack_fffffffffffffb78;
  QNetworkAccessCacheBackend *in_stack_fffffffffffffb80;
  QObject *in_stack_fffffffffffffb88;
  QAnyStringView *in_stack_fffffffffffffb90;
  QNetworkRequest *in_stack_fffffffffffffb98;
  undefined4 in_stack_fffffffffffffba0;
  Operation in_stack_fffffffffffffba4;
  uint uVar16;
  QNetworkAccessManagerPrivate *in_stack_fffffffffffffba8;
  undefined7 in_stack_fffffffffffffbb0;
  undefined1 in_stack_fffffffffffffbb7;
  undefined1 uVar17;
  undefined8 in_stack_fffffffffffffbc8;
  QNetworkCookieJar *pQVar18;
  undefined4 in_stack_fffffffffffffbd0;
  undefined4 in_stack_fffffffffffffbd4;
  QHstsCache *in_stack_fffffffffffffbd8;
  QNetworkReply *req_00;
  undefined4 in_stack_fffffffffffffbe0;
  undefined4 uVar19;
  Operation in_stack_fffffffffffffbe4;
  Operation op_00;
  QNetworkReplyImplPrivate *in_stack_fffffffffffffbe8;
  QIODevice *in_stack_fffffffffffffc00;
  undefined4 in_stack_fffffffffffffc08;
  byte bVar20;
  byte bVar21;
  undefined7 in_stack_fffffffffffffc18;
  byte bVar22;
  byte bVar23;
  QNetworkReplyHttpImpl *in_stack_fffffffffffffc20;
  Operation in_stack_fffffffffffffc4c;
  uint uVar24;
  undefined1 in_stack_fffffffffffffc50 [16];
  undefined7 in_stack_fffffffffffffc60;
  undefined1 in_stack_fffffffffffffc67;
  QNetworkReply *local_348;
  QUrl local_320;
  QUrl local_318 [6];
  QUrl local_2e8;
  undefined8 local_2e0;
  undefined8 local_2d8;
  undefined8 local_2d0;
  undefined1 local_2c8 [40];
  undefined8 local_2a0;
  undefined8 local_298;
  QLatin1StringView local_290;
  QLatin1StringView local_280;
  QUrl local_270 [4];
  QLatin1StringView local_250;
  QUrl local_240;
  undefined8 local_238;
  undefined8 local_230;
  undefined8 local_228;
  QUrl local_220;
  rep local_218;
  rep local_210;
  undefined8 local_208;
  int local_1fc;
  char16_t local_1f8 [88];
  QVariant local_148;
  QVariant local_128;
  QVariant local_108;
  QVariant local_e8;
  QVariant local_c8;
  QVariant local_a8;
  QVariant local_88;
  QVariant local_68;
  QVariant local_48;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_1fc = in_ESI;
  pQVar6 = d_func((QNetworkAccessManager *)0x19ce90);
  local_208 = 0xaaaaaaaaaaaaaaaa;
  QNetworkRequest::QNetworkRequest
            ((QNetworkRequest *)in_stack_fffffffffffffb80,
             (QNetworkRequest *)in_stack_fffffffffffffb78.__r);
  RVar4 = redirectPolicy((QNetworkAccessManager *)in_stack_fffffffffffffb80);
  bVar22 = 0;
  bVar23 = bVar22;
  if (RVar4 != NoLessSafeRedirectPolicy) {
    QVariant::QVariant((QVariant *)0x19cef6);
    QNetworkRequest::attribute
              ((QNetworkRequest *)in_stack_fffffffffffffb88,
               (Attribute)((ulong)in_stack_fffffffffffffb98 >> 0x20),
               (QVariant *)in_stack_fffffffffffffb80);
    bVar22 = QVariant::isNull();
    bVar23 = bVar22;
    QVariant::~QVariant(&local_28);
    QVariant::~QVariant(&local_48);
  }
  if ((bVar22 & 1) != 0) {
    RVar4 = redirectPolicy((QNetworkAccessManager *)in_stack_fffffffffffffb80);
    QVariant::QVariant(&local_68,RVar4);
    QNetworkRequest::setAttribute
              ((QNetworkRequest *)in_stack_fffffffffffffb90,
               (Attribute)((ulong)in_stack_fffffffffffffb98 >> 0x20),
               (QVariant *)in_stack_fffffffffffffb88);
    QVariant::~QVariant(&local_68);
  }
  local_210 = (rep)QNetworkRequest::transferTimeoutAsDuration
                             ((QNetworkRequest *)in_stack_fffffffffffffb80);
  local_218 = (rep)ms<(char)48>();
  bVar1 = std::chrono::operator==
                    ((duration<long,_std::ratio<1L,_1000L>_> *)in_stack_fffffffffffffb88,
                     (duration<long,_std::ratio<1L,_1000L>_> *)in_stack_fffffffffffffb80);
  if (bVar1) {
    transferTimeoutAsDuration((QNetworkAccessManager *)in_stack_fffffffffffffb80);
    QNetworkRequest::setTransferTimeout((QNetworkRequest *)0x19d033,in_stack_fffffffffffffb78);
  }
  bVar1 = autoDeleteReplies((QNetworkAccessManager *)0x19d040);
  bVar20 = 0;
  bVar21 = bVar20;
  if (bVar1) {
    QVariant::QVariant((QVariant *)0x19d06f);
    QNetworkRequest::attribute
              ((QNetworkRequest *)in_stack_fffffffffffffb88,
               (Attribute)((ulong)in_stack_fffffffffffffb98 >> 0x20),
               (QVariant *)in_stack_fffffffffffffb80);
    bVar20 = QVariant::isNull();
    bVar21 = bVar20;
    QVariant::~QVariant(&local_88);
    QVariant::~QVariant(&local_a8);
  }
  if ((bVar20 & 1) != 0) {
    QVariant::QVariant(&local_c8,true);
    QNetworkRequest::setAttribute
              ((QNetworkRequest *)in_stack_fffffffffffffb90,
               (Attribute)((ulong)in_stack_fffffffffffffb98 >> 0x20),
               (QVariant *)in_stack_fffffffffffffb88);
    QVariant::~QVariant(&local_c8);
  }
  QNetworkRequest::url((QNetworkRequest *)in_stack_fffffffffffffb88);
  bVar2 = QUrl::isLocalFile();
  QUrl::~QUrl(&local_220);
  bVar3 = bVar2 & 1;
  local_238 = 0xaaaaaaaaaaaaaaaa;
  local_230 = 0xaaaaaaaaaaaaaaaa;
  local_228 = 0xaaaaaaaaaaaaaaaa;
  QNetworkRequest::url((QNetworkRequest *)in_stack_fffffffffffffb88);
  QUrl::scheme();
  QUrl::~QUrl(&local_240);
  local_250 = Qt::Literals::StringLiterals::operator____L1
                        ((char *)in_stack_fffffffffffffb88,(size_t)in_stack_fffffffffffffb80);
  bVar1 = ::operator==((QString *)in_stack_fffffffffffffb88,
                       (QLatin1StringView *)in_stack_fffffffffffffb80);
  if (bVar1) {
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)in_stack_fffffffffffffb98,(size_t)in_stack_fffffffffffffb90);
    QString::operator=((QString *)in_stack_fffffffffffffb80,(QString *)in_stack_fffffffffffffb78.__r
                      );
    QString::~QString((QString *)0x19d25f);
    local_270[0].d = (QUrlPrivate *)0xaaaaaaaaaaaaaaaa;
    QNetworkRequest::url((QNetworkRequest *)in_stack_fffffffffffffb88);
    QUrl::setScheme((QString *)local_270);
    QNetworkRequest::setUrl
              ((QNetworkRequest *)in_stack_fffffffffffffb80,(QUrl *)in_stack_fffffffffffffb78.__r);
    QUrl::~QUrl(local_270);
  }
  if ((local_1fc == 2) || (local_1fc == 1)) {
    in_stack_fffffffffffffc08 = CONCAT13(1,(int3)in_stack_fffffffffffffc08);
    if (bVar3 == 0) {
      local_280 = Qt::Literals::StringLiterals::operator____L1
                            ((char *)in_stack_fffffffffffffb88,(size_t)in_stack_fffffffffffffb80);
      bVar1 = ::operator==((QString *)in_stack_fffffffffffffb88,
                           (QLatin1StringView *)in_stack_fffffffffffffb80);
      in_stack_fffffffffffffc08 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffc08);
    }
    if ((char)((uint)in_stack_fffffffffffffc08 >> 0x18) != '\0') {
      local_348 = (QNetworkReply *)operator_new(0x10);
      QNetworkReplyFileImpl::QNetworkReplyFileImpl
                ((QNetworkReplyFileImpl *)
                 CONCAT17(in_stack_fffffffffffffc67,in_stack_fffffffffffffc60),
                 in_stack_fffffffffffffc50._8_8_,in_stack_fffffffffffffc50._0_8_,
                 in_stack_fffffffffffffc4c);
      goto LAB_0019dc3d;
    }
    local_290 = Qt::Literals::StringLiterals::operator____L1
                          ((char *)in_stack_fffffffffffffb88,(size_t)in_stack_fffffffffffffb80);
    bVar1 = ::operator==((QString *)in_stack_fffffffffffffb88,
                         (QLatin1StringView *)in_stack_fffffffffffffb80);
    if (bVar1) {
      local_348 = (QNetworkReply *)operator_new(0x10);
      QNetworkReplyDataImpl::QNetworkReplyDataImpl
                ((QNetworkReplyDataImpl *)
                 CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0),
                 (QObject *)in_stack_fffffffffffffba8,
                 (QNetworkRequest *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                 (Operation)((ulong)in_stack_fffffffffffffb98 >> 0x20));
      goto LAB_0019dc3d;
    }
    QVariant::QVariant(&local_108,1);
    QNetworkRequest::attribute
              ((QNetworkRequest *)in_stack_fffffffffffffb88,
               (Attribute)((ulong)in_stack_fffffffffffffb98 >> 0x20),
               (QVariant *)in_stack_fffffffffffffb80);
    iVar5 = QVariant::toInt((bool *)&local_e8);
    QVariant::~QVariant(&local_e8);
    QVariant::~QVariant(&local_108);
    if (iVar5 == 3) {
      local_348 = (QNetworkReply *)operator_new(0x10);
      QNetworkReplyImpl::QNetworkReplyImpl
                ((QNetworkReplyImpl *)in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
      req_00 = local_348;
      pQVar7 = QNetworkReplyImpl::d_func((QNetworkReplyImpl *)0x19d4c2);
      QPointer<QNetworkAccessManager>::operator=
                ((QPointer<QNetworkAccessManager> *)in_stack_fffffffffffffb80,
                 (QNetworkAccessManager *)in_stack_fffffffffffffb78.__r);
      pvVar8 = operator_new(0x18);
      uVar19 = SUB84(pvVar8,0);
      op_00 = (Operation)((ulong)pvVar8 >> 0x20);
      QNetworkAccessCacheBackend::QNetworkAccessCacheBackend(in_stack_fffffffffffffb80);
      pQVar7->backend = (QNetworkAccessBackend *)CONCAT44(op_00,uVar19);
      pQVar13 = (QNetworkReplyImplPrivate *)pQVar7->backend;
      d_func((QNetworkAccessManager *)0x19d532);
      QNetworkAccessBackend::setManagerPrivate
                (&in_stack_fffffffffffffb80->super_QNetworkAccessBackend,
                 (QNetworkAccessManagerPrivate *)in_stack_fffffffffffffb78.__r);
      QObject::setParent(&pQVar7->backend->super_QObject);
      QNetworkAccessBackend::setReplyPrivate
                (&in_stack_fffffffffffffb80->super_QNetworkAccessBackend,
                 (QNetworkReplyImplPrivate *)in_stack_fffffffffffffb78.__r);
      QNetworkReplyImplPrivate::setup
                (pQVar13,op_00,(QNetworkRequest *)req_00,
                 (QIODevice *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0));
      goto LAB_0019dc3d;
    }
  }
  local_298 = 0xaaaaaaaaaaaaaaaa;
  QNetworkRequest::QNetworkRequest
            ((QNetworkRequest *)in_stack_fffffffffffffb80,
             (QNetworkRequest *)in_stack_fffffffffffffb78.__r);
  local_2a0 = 0xaaaaaaaaaaaaaaaa;
  QNetworkRequest::headers((QNetworkRequest *)in_stack_fffffffffffffb88);
  bVar1 = QHttpHeaders::contains
                    ((QHttpHeaders *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                     (WellKnownHeader)((ulong)in_stack_fffffffffffffb98 >> 0x20));
  if (((!bVar1) && (in_RCX != (long *)0x0)) &&
     (uVar9 = (**(code **)(*in_RCX + 0x60))(), (uVar9 & 1) == 0)) {
    iVar5 = (**(code **)(*in_RCX + 0x80))();
    QByteArray::number((longlong)local_2c8,iVar5);
    QAnyStringView::QAnyStringView
              (in_stack_fffffffffffffb90,(QByteArray *)in_stack_fffffffffffffb88);
    value.m_size._0_4_ = in_stack_fffffffffffffbd0;
    value.field_0 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)in_stack_fffffffffffffbc8;
    value.m_size._4_4_ = in_stack_fffffffffffffbd4;
    QHttpHeaders::append
              ((QHttpHeaders *)in_stack_fffffffffffffb98,
               (WellKnownHeader)((ulong)in_stack_fffffffffffffb90 >> 0x20),value);
    QByteArray::~QByteArray((QByteArray *)0x19d6a6);
  }
  QVariant::QVariant(&local_148,0);
  QNetworkRequest::attribute
            ((QNetworkRequest *)in_stack_fffffffffffffb88,
             (Attribute)((ulong)in_stack_fffffffffffffb98 >> 0x20),
             (QVariant *)in_stack_fffffffffffffb80);
  iVar5 = QVariant::toInt((bool *)&local_128);
  QVariant::~QVariant(&local_128);
  QVariant::~QVariant(&local_148);
  if ((iVar5 == 0) && (pQVar6->cookieJar != (QNetworkCookieJar *)0x0)) {
    local_2e0 = 0xaaaaaaaaaaaaaaaa;
    local_2d8 = 0xaaaaaaaaaaaaaaaa;
    local_2d0 = 0xaaaaaaaaaaaaaaaa;
    pQVar18 = pQVar6->cookieJar;
    QNetworkRequest::url((QNetworkRequest *)in_stack_fffffffffffffb88);
    (**(code **)(*(long *)pQVar18 + 0x60))(&local_2e0,pQVar18,&local_2e8);
    QUrl::~QUrl(&local_2e8);
    bVar1 = QList<QNetworkCookie>::isEmpty((QList<QNetworkCookie> *)0x19d7b4);
    if (!bVar1) {
      QNetworkHeadersPrivate::fromCookieList((QList<QNetworkCookie> *)in_stack_fffffffffffffb90);
      QAnyStringView::QAnyStringView
                (in_stack_fffffffffffffb90,(QByteArray *)in_stack_fffffffffffffb88);
      newValue.field_0._4_4_ = in_stack_fffffffffffffbe4;
      newValue.field_0._0_4_ = in_stack_fffffffffffffbe0;
      newValue.m_size = (size_t)in_stack_fffffffffffffbe8;
      QHttpHeaders::replaceOrAppend
                ((QHttpHeaders *)in_stack_fffffffffffffb88,
                 (WellKnownHeader)((ulong)in_stack_fffffffffffffb80 >> 0x20),newValue);
      QByteArray::~QByteArray((QByteArray *)0x19d811);
    }
    QList<QNetworkCookie>::~QList((QList<QNetworkCookie> *)0x19d81e);
  }
  QNetworkRequest::setHeaders
            ((QNetworkRequest *)in_stack_fffffffffffffb80,
             (QHttpHeaders *)in_stack_fffffffffffffb78.__r);
  memcpy(local_1f8,L"http",0xaa);
  pacVar10 = const((char16_t (*) [5] [17])local_1f8);
  const((char16_t (*) [5] [17])local_1f8);
  pacVar11 = const((char16_t (*) [17])CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                   (char16_t (*) [17])in_stack_fffffffffffffb98,(QString *)in_stack_fffffffffffffb90
                  );
  pacVar12 = const((char16_t (*) [5] [17])local_1f8);
  if (pacVar11 == pacVar12) {
    local_348 = (QNetworkReply *)operator_new(0x10);
    QNetworkReplyImpl::QNetworkReplyImpl((QNetworkReplyImpl *)local_348,in_stack_fffffffffffffb88);
    pQVar13 = QNetworkReplyImpl::d_func((QNetworkReplyImpl *)0x19db07);
    QPointer<QNetworkAccessManager>::operator=
              ((QPointer<QNetworkAccessManager> *)in_stack_fffffffffffffb80,
               (QNetworkAccessManager *)in_stack_fffffffffffffb78.__r);
    pQVar14 = QNetworkAccessManagerPrivate::findBackend
                        (in_stack_fffffffffffffba8,in_stack_fffffffffffffba4,
                         in_stack_fffffffffffffb98);
    pQVar13->backend = pQVar14;
    if (pQVar13->backend != (QNetworkAccessBackend *)0x0) {
      QObject::setParent(&pQVar13->backend->super_QObject);
      QNetworkAccessBackend::setReplyPrivate
                (&in_stack_fffffffffffffb80->super_QNetworkAccessBackend,
                 (QNetworkReplyImplPrivate *)in_stack_fffffffffffffb78.__r);
    }
    QNetworkRequest::sslConfiguration(in_stack_fffffffffffffb98);
    QNetworkReply::setSslConfiguration
              ((QNetworkReply *)in_stack_fffffffffffffb80,
               (QSslConfiguration *)in_stack_fffffffffffffb78.__r);
    QSslConfiguration::~QSslConfiguration((QSslConfiguration *)0x19dbe4);
    QNetworkReplyImplPrivate::setup
              (in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe4,
               (QNetworkRequest *)in_stack_fffffffffffffbd8,
               (QIODevice *)CONCAT44(iVar5,in_stack_fffffffffffffbd0));
  }
  else {
    QVar15 = Qt::Literals::StringLiterals::operator____L1
                       ((char *)in_stack_fffffffffffffb88,(size_t)in_stack_fffffffffffffb80);
    bVar3 = QString::startsWith((QLatin1String *)&local_238,(CaseSensitivity)QVar15.m_size);
    uVar24 = 0;
    uVar17 = false;
    if ((bVar3 & 1) == 0) {
      bVar1 = isStrictTransportSecurityEnabled((QNetworkAccessManager *)in_stack_fffffffffffffb80);
      uVar17 = false;
      if (bVar1) {
        QNetworkRequest::url((QNetworkRequest *)in_stack_fffffffffffffb88);
        uVar24 = 0x1000000;
        uVar17 = QHstsCache::isKnownHost
                           (in_stack_fffffffffffffbd8,
                            (QUrl *)CONCAT44(iVar5,in_stack_fffffffffffffbd0));
      }
    }
    uVar16 = (uint)(byte)uVar17 << 0x18;
    if ((uVar24 & 0x1000000) != 0) {
      QUrl::~QUrl(local_318);
    }
    if ((uVar16 & 0x1000000) != 0) {
      local_320.d = (QUrlPrivate *)0xaaaaaaaaaaaaaaaa;
      QNetworkRequest::url((QNetworkRequest *)in_stack_fffffffffffffb88);
      iVar5 = QUrl::port((int)&local_320);
      if (iVar5 == 0x50) {
        QUrl::setPort((int)&local_320);
      }
      Qt::Literals::StringLiterals::operator____L1
                ((char *)in_stack_fffffffffffffb88,(size_t)in_stack_fffffffffffffb80);
      QVar15.m_size._7_1_ = uVar17;
      QVar15.m_size._0_7_ = in_stack_fffffffffffffbb0;
      QVar15.m_data = (char *)pacVar10;
      QString::QString((QString *)in_stack_fffffffffffffb90,QVar15);
      QUrl::setScheme((QString *)&local_320);
      QString::~QString((QString *)0x19da48);
      QNetworkRequest::setUrl
                ((QNetworkRequest *)in_stack_fffffffffffffb80,(QUrl *)in_stack_fffffffffffffb78.__r)
      ;
      QUrl::~QUrl(&local_320);
    }
    local_348 = (QNetworkReply *)operator_new(0x10);
    QNetworkReplyHttpImpl::QNetworkReplyHttpImpl
              (in_stack_fffffffffffffc20,
               (QNetworkAccessManager *)CONCAT17(bVar23,in_stack_fffffffffffffc18),in_RDI,
               (Operation *)
               CONCAT17(bVar22,CONCAT16(bVar21,CONCAT15(bVar20,CONCAT14(bVar2,
                                                  in_stack_fffffffffffffc08)))),
               in_stack_fffffffffffffc00);
  }
  QHttpHeaders::~QHttpHeaders((QHttpHeaders *)0x19dc30);
  QNetworkRequest::~QNetworkRequest((QNetworkRequest *)in_stack_fffffffffffffb80);
LAB_0019dc3d:
  QString::~QString((QString *)0x19dc4a);
  QNetworkRequest::~QNetworkRequest((QNetworkRequest *)in_stack_fffffffffffffb80);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_348;
  }
  __stack_chk_fail();
}

Assistant:

QNetworkReply *QNetworkAccessManager::createRequest(QNetworkAccessManager::Operation op,
                                                    const QNetworkRequest &originalReq,
                                                    QIODevice *outgoingData)
{
    Q_D(QNetworkAccessManager);

    QNetworkRequest req(originalReq);
    if (redirectPolicy() != QNetworkRequest::NoLessSafeRedirectPolicy
        && req.attribute(QNetworkRequest::RedirectPolicyAttribute).isNull()) {
        req.setAttribute(QNetworkRequest::RedirectPolicyAttribute, redirectPolicy());
    }

#if QT_CONFIG(http) || defined (Q_OS_WASM)
    if (req.transferTimeoutAsDuration() == 0ms)
        req.setTransferTimeout(transferTimeoutAsDuration());
#endif

    if (autoDeleteReplies()
        && req.attribute(QNetworkRequest::AutoDeleteReplyOnFinishAttribute).isNull()) {
        req.setAttribute(QNetworkRequest::AutoDeleteReplyOnFinishAttribute, true);
    }

    bool isLocalFile = req.url().isLocalFile();
    QString scheme = req.url().scheme();

    // Remap local+http to unix+http to make further processing easier
    if (scheme == "local+http"_L1) {
        scheme = u"unix+http"_s;
        QUrl url = req.url();
        url.setScheme(scheme);
        req.setUrl(url);
    }

    // fast path for GET on file:// URLs
    // The QNetworkAccessFileBackend will right now only be used for PUT
    if (op == QNetworkAccessManager::GetOperation
     || op == QNetworkAccessManager::HeadOperation) {
        if (isLocalFile
#ifdef Q_OS_ANDROID
            || scheme == "assets"_L1
#endif
            || scheme == "qrc"_L1) {
            return new QNetworkReplyFileImpl(this, req, op);
        }

        if (scheme == "data"_L1)
            return new QNetworkReplyDataImpl(this, req, op);

        // A request with QNetworkRequest::AlwaysCache does not need any bearer management
        QNetworkRequest::CacheLoadControl mode =
            static_cast<QNetworkRequest::CacheLoadControl>(
                req.attribute(QNetworkRequest::CacheLoadControlAttribute,
                              QNetworkRequest::PreferNetwork).toInt());
        if (mode == QNetworkRequest::AlwaysCache) {
            // FIXME Implement a QNetworkReplyCacheImpl instead, see QTBUG-15106
            QNetworkReplyImpl *reply = new QNetworkReplyImpl(this);
            QNetworkReplyImplPrivate *priv = reply->d_func();
            priv->manager = this;
            priv->backend = new QNetworkAccessCacheBackend();
            priv->backend->setManagerPrivate(this->d_func());
            priv->backend->setParent(reply);
            priv->backend->setReplyPrivate(priv);
            priv->setup(op, req, outgoingData);
            return reply;
        }
    }
    QNetworkRequest request = req;
    auto h = request.headers();
#ifndef Q_OS_WASM // Content-length header is not allowed to be set by user in wasm
    if (!h.contains(QHttpHeaders::WellKnownHeader::ContentLength) &&
        outgoingData && !outgoingData->isSequential()) {
        // request has no Content-Length
        // but the data that is outgoing is random-access
        h.append(QHttpHeaders::WellKnownHeader::ContentLength,
                 QByteArray::number(outgoingData->size()));
    }
#endif
    if (static_cast<QNetworkRequest::LoadControl>
        (request.attribute(QNetworkRequest::CookieLoadControlAttribute,
                           QNetworkRequest::Automatic).toInt()) == QNetworkRequest::Automatic) {
        if (d->cookieJar) {
            QList<QNetworkCookie> cookies = d->cookieJar->cookiesForUrl(request.url());
            if (!cookies.isEmpty())
                h.replaceOrAppend(QHttpHeaders::WellKnownHeader::Cookie,
                                  QNetworkHeadersPrivate::fromCookieList(cookies));
        }
    }
    request.setHeaders(std::move(h));
#ifdef Q_OS_WASM
    Q_UNUSED(isLocalFile);
    // Support http, https, and relative urls
    if (scheme == "http"_L1 || scheme == "https"_L1 || scheme.isEmpty()) {
        QNetworkReplyWasmImpl *reply = new QNetworkReplyWasmImpl(this);
        QNetworkReplyWasmImplPrivate *priv = reply->d_func();
        priv->manager = this;
        priv->setup(op, request, outgoingData);
        return reply;
    }
#endif

#if QT_CONFIG(http)
    constexpr char16_t httpSchemes[][17] = {
        u"http",
        u"preconnect-http",
#ifndef QT_NO_SSL
        u"https",
        u"preconnect-https",
#endif
        u"unix+http",
    };
    // Since Qt 5 we use the new QNetworkReplyHttpImpl
    if (std::find(std::begin(httpSchemes), std::end(httpSchemes), scheme) != std::end(httpSchemes)) {

#ifndef QT_NO_SSL
        const bool isLocalSocket = scheme.startsWith("unix"_L1);
        if (!isLocalSocket && isStrictTransportSecurityEnabled()
            && d->stsCache.isKnownHost(request.url())) {
            QUrl stsUrl(request.url());
            // RFC6797, 8.3:
            // The UA MUST replace the URI scheme with "https" [RFC2818],
            // and if the URI contains an explicit port component of "80",
            // then the UA MUST convert the port component to be "443", or
            // if the URI contains an explicit port component that is not
            // equal to "80", the port component value MUST be preserved;
            // otherwise,
            // if the URI does not contain an explicit port component, the UA
            // MUST NOT add one.
            if (stsUrl.port() == 80)
                stsUrl.setPort(443);
            stsUrl.setScheme("https"_L1);
            request.setUrl(stsUrl);
        }
#endif
        QNetworkReplyHttpImpl *reply = new QNetworkReplyHttpImpl(this, request, op, outgoingData);
        return reply;
    }
#endif // QT_CONFIG(http)

    // first step: create the reply
    QNetworkReplyImpl *reply = new QNetworkReplyImpl(this);
    QNetworkReplyImplPrivate *priv = reply->d_func();
    priv->manager = this;

    // second step: fetch cached credentials
    // This is not done for the time being, we should use signal emissions to request
    // the credentials from cache.

    // third step: find a backend
    priv->backend = d->findBackend(op, request);

    if (priv->backend) {
        priv->backend->setParent(reply);
        priv->backend->setReplyPrivate(priv);
    }

#ifndef QT_NO_SSL
    reply->setSslConfiguration(request.sslConfiguration());
#endif

    // fourth step: setup the reply
    priv->setup(op, request, outgoingData);

    return reply;
}